

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcStatesStatesFixedScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,int *child1States,float *child1TransMat,
          int *child2States,float *child2TransMat,float *scaleFactors,int startPattern,
          int endPattern)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int local_64;
  
  iVar2 = this->kCategoryCount;
  if (0 < iVar2) {
    iVar12 = 0;
    local_64 = 0;
    iVar3 = this->kPartialsPaddedStateCount;
    iVar4 = this->kPatternCount;
    iVar5 = this->kStateCount;
    iVar6 = this->kMatrixSize;
    do {
      if (startPattern < endPattern) {
        iVar15 = (iVar4 * local_64 + startPattern) * iVar3;
        iVar7 = this->kTransPaddedStateCount;
        lVar13 = (long)startPattern;
        do {
          if (0 < iVar5) {
            iVar8 = child1States[lVar13];
            fVar1 = scaleFactors[lVar13];
            iVar9 = child2States[lVar13];
            lVar14 = 0;
            lVar16 = (long)iVar12;
            do {
              lVar10 = iVar8 + lVar16;
              lVar11 = iVar9 + lVar16;
              lVar16 = lVar16 + iVar7;
              destP[iVar15 + lVar14] = (child1TransMat[lVar10] * child2TransMat[lVar11]) / fVar1;
              lVar14 = lVar14 + 1;
            } while (iVar5 != (int)lVar14);
            iVar15 = iVar15 + (int)lVar14;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != endPattern);
      }
      iVar12 = iVar12 + iVar6;
      local_64 = local_64 + 1;
    } while (local_64 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                     const int* child1States,
                                                                     const REALTYPE* child1TransMat,
                                                                     const int* child2States,
                                                                     const REALTYPE* child2TransMat,
                                                                     const REALTYPE* scaleFactors,
                                                                     int startPattern,
                                                                     int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
    int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = child1States[k];
            const int state2 = child2States[k];
            int w = l * kMatrixSize;
            REALTYPE scaleFactor = scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = child1TransMat[w + state1] *
                           child2TransMat[w + state2] / scaleFactor;
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}